

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.hpp
# Opt level: O2

uhugeint_t
duckdb::AddOperatorOverflowCheck::
Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
          (uhugeint_t left,uhugeint_t right)

{
  bool bVar1;
  OutOfRangeException *this;
  PhysicalType type;
  allocator local_c1;
  uhugeint_t result;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar1 = TryAddOperator::Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                    (left,right,&result);
  if (bVar1) {
    return result;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Overflow in addition of %s (%s + %s)!",&local_c1);
  TypeIdToString_abi_cxx11_(&local_70,(duckdb *)0xcb,type);
  NumericHelper::ToString<duckdb::uhugeint_t>(&local_90,left);
  NumericHelper::ToString<duckdb::uhugeint_t>(&local_b0,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
             &local_90,&local_b0);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryAddOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in addition of %s (%s + %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}